

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O1

bool __thiscall
axl::sl::
Array<axl::sl::BoxListEntry<axl::rc::Ptr<void>>*,axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>>*>>
::
setCountImpl<axl::sl::SimpleArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>>*>::ZeroConstruct>
          (Array<axl::sl::BoxListEntry<axl::rc::Ptr<void>>*,axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>>*>>
           *this,size_t count)

{
  int *piVar1;
  long lVar2;
  ulong uVar3;
  undefined8 *puVar4;
  BufHdr *pBVar5;
  size_t sVar6;
  EVP_PKEY_CTX *dst;
  size_t __n;
  void *__s;
  BufHdr *dst_00;
  bool bVar7;
  Ptr<axl::rc::BufHdr> hdr;
  Ptr<axl::rc::BufHdr> local_38;
  
  __n = count * 8;
  lVar2 = *(long *)(this + 8);
  if ((lVar2 == 0) || (*(int *)(lVar2 + 0x10) != 1)) {
LAB_0014c1df:
    if (count == 0) {
      ArrayRef<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
      ::release((ArrayRef<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
                 *)this);
      return true;
    }
    if (*(long *)(this + 0x10) != 0) {
      sVar6 = getAllocSize<4096ul>(__n);
      dst = (EVP_PKEY_CTX *)operator_new(sVar6 + 0x28,(nothrow_t *)&std::nothrow);
      *(undefined4 *)(dst + 0x10) = 0;
      *(undefined4 *)(dst + 0x14) = 1;
      *(undefined ***)dst = &PTR__RefCount_0019ca28;
      *(size_t *)(dst + 0x18) = sVar6;
      *(undefined8 *)(dst + 0x20) = 0;
      *(code **)(dst + 8) = mem::deallocate;
      local_38.m_p = (BufHdr *)0x0;
      local_38.m_refCount = (RefCount *)0x0;
      rc::Ptr<axl::rc::BufHdr>::copy(&local_38,dst,dst);
      bVar7 = local_38.m_p != (BufHdr *)0x0;
      if (bVar7) {
        dst_00 = local_38.m_p + 1;
        if (*(ulong *)(this + 0x10) < count) {
          __wrap_memcpy(dst_00,*(void **)this,*(ulong *)(this + 0x10) << 3);
          memset(&(dst_00->super_RefCount)._vptr_RefCount + *(long *)(this + 0x10),0,
                 (count - *(long *)(this + 0x10)) * 8);
        }
        else {
          __wrap_memcpy(dst_00,*(void **)this,__n);
        }
        puVar4 = *(undefined8 **)(this + 8);
        LOCK();
        piVar1 = (int *)(puVar4 + 2);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          (**(code **)*puVar4)(puVar4);
          LOCK();
          piVar1 = (int *)((long)puVar4 + 0x14);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if ((*piVar1 == 0) && ((code *)puVar4[1] != (code *)0x0)) {
            (*(code *)puVar4[1])(puVar4);
          }
        }
        pBVar5 = local_38.m_p;
        *(BufHdr **)this = dst_00;
        local_38.m_p = (BufHdr *)0x0;
        local_38.m_refCount = (RefCount *)0x0;
        *(BufHdr **)(this + 8) = pBVar5;
        *(size_t *)(this + 0x10) = count;
      }
      rc::Ptr<axl::rc::BufHdr>::clear(&local_38);
      return bVar7;
    }
    bVar7 = Array<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
            ::reserve((Array<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*>_>
                       *)this,count);
    if (!bVar7) {
      return bVar7;
    }
    __s = *(void **)this;
  }
  else {
    uVar3 = *(ulong *)(this + 0x10);
    bVar7 = true;
    if (count == uVar3) {
      return true;
    }
    if (*(ulong *)(lVar2 + 0x18) < __n) goto LAB_0014c1df;
    if (count < uVar3 || count - uVar3 == 0) goto LAB_0014c336;
    __s = (void *)(uVar3 * 8 + *(long *)this);
    __n = (count - uVar3) * 8;
  }
  memset(__s,0,__n);
LAB_0014c336:
  *(size_t *)(this + 0x10) = count;
  return bVar7;
}

Assistant:

bool
	setCountImpl(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1) {
			if (this->m_count == count)
				return true;

			if (this->m_hdr->m_bufferSize >= size) {
				if (count > this->m_count)
					Construct() (this->m_p + this->m_count, count - this->m_count);
				else
					Details::destruct(this->m_p + count, this->m_count - count);

				Details::setHdrCount(this->m_hdr, count);
				this->m_count = count;
				return true;
			}
		}

		if (count == 0) {
			this->release();
			return true;
		}

		if (!this->m_count) {
			bool result = reserve(count);
			if (!result)
				return false;

			Construct() (this->m_p, count);
			Details::setHdrCount(this->m_hdr, count);
			this->m_count = count;
			return true;
		}

		ASSERT(this->m_hdr);

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, count);

		T* p = (T*)(hdr + 1);

		if (count <= this->m_count) {
			Details::constructCopy(p, this->m_p, count);
		} else {
			Details::constructCopy(p, this->m_p, this->m_count);
			Construct() (p + this->m_count, count - this->m_count);
		}

		this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		this->m_count = count;
		return true;
	}